

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O1

void small_suite::test_zero(void)

{
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  encoder_type encoder;
  undefined4 local_64;
  ulong local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38 [2];
  
  local_38[0].buffer = &local_58;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38[0].super_base<unsigned_char>._vptr_base = (_func_int **)&PTR__base_00112ca8;
  bVar1 = trial::protocol::buffer::vector<unsigned_char,_std::allocator<unsigned_char>_>::grow
                    (local_38,1);
  if (bVar1) {
    (*local_38[0].super_base<unsigned_char>._vptr_base[3])(local_38,0);
  }
  local_60 = (ulong)bVar1;
  local_64 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(std::int8_t(0))","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x66,"void small_suite::test_zero()",&local_60,&local_64);
  local_60 = (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  local_64 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("buffer.size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x67,"void small_suite::test_zero()",&local_60,&local_64);
  local_60 = local_60 & 0xffffffff00000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[0]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x68,"void small_suite::test_zero()",
             local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,&local_60);
  (**local_38[0].super_base<unsigned_char>._vptr_base)();
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_zero()
{
    std::vector<output_type> buffer;
    encoder_type encoder(buffer);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(std::int8_t(0)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(buffer.size(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(buffer[0], 0x00);
}